

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

GLuint glcts::findLSB(GLuint input)

{
  undefined4 local_14;
  undefined4 local_10;
  GLuint result;
  GLuint input_local;
  
  if (input == 0) {
    result = 0xffffffff;
  }
  else {
    local_14 = 0;
    for (local_10 = input; (local_10 & 1) == 0; local_10 = local_10 >> 1) {
      local_14 = local_14 + 1;
    }
    result = local_14;
  }
  return result;
}

Assistant:

static GLuint findLSB(GLuint input)
{
	if (!input)
	{
		return -1;
	}
	for (GLuint result = 0;; ++result)
	{
		if (input & 1)
		{
			return result;
		}
		input >>= 1;
	}
}